

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall cmCursesMainForm::InitializeUI(cmCursesMainForm *this)

{
  vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *this_00;
  bool bVar1;
  CacheEntryType CVar2;
  pointer pbVar3;
  cmState *pcVar4;
  size_type __n;
  cmCursesCacheEntryComposite *pcVar5;
  cmCursesWidget *this_01;
  reference pbVar6;
  cmCursesCacheEntryComposite *local_120;
  CacheEntryType local_114;
  undefined1 local_110 [4];
  CacheEntryType t_2;
  string key_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e0;
  const_iterator it_2;
  undefined1 local_c8 [4];
  CacheEntryType t_1;
  string key;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  const_iterator it_1;
  string local_88;
  cmCursesCacheEntryComposite *local_68;
  cmCursesCacheEntryComposite *comp;
  int entrywidth;
  CacheEntryType t;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  const_iterator it;
  int count;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *newEntries;
  cmCursesMainForm *this_local;
  
  pbVar3 = (pointer)operator_new(0x18);
  std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>::vector
            ((vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
              *)pbVar3);
  cacheKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar3;
  pcVar4 = cmake::GetState(this->CMakeInstance);
  cmState::GetCacheEntryKeys_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30,pcVar4);
  pbVar3 = cacheKeys.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __n = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_30);
  std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>::
  reserve((vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *)
          pbVar3,__n);
  it._M_current._0_4_ = 0;
  local_50._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_30);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_48,&local_50);
  while( true ) {
    _entrywidth = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_30);
    bVar1 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&entrywidth);
    if (!bVar1) break;
    pcVar4 = cmake::GetState(this->CMakeInstance);
    pbVar6 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_48);
    comp._4_4_ = cmState::GetCacheEntryType(pcVar4,pbVar6);
    if (((comp._4_4_ != INTERNAL) && (comp._4_4_ != STATIC)) && (comp._4_4_ != UNINITIALIZED)) {
      it._M_current._0_4_ = (int)it._M_current + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_48);
  }
  comp._0_4_ = this->InitialWidth + -0x23;
  if ((int)it._M_current == 0) {
    pcVar5 = (cmCursesCacheEntryComposite *)operator_new(0x40);
    it_1._M_current._6_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_88,"EMPTY CACHE",(allocator *)((long)&it_1._M_current + 7));
    cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(pcVar5,&local_88,0x1e,0x1e);
    it_1._M_current._6_1_ = 0;
    local_68 = pcVar5;
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it_1._M_current + 7));
    this_01 = (cmCursesWidget *)operator_new(0x40);
    cmCursesDummyWidget::cmCursesDummyWidget((cmCursesDummyWidget *)this_01,1,1,1,1);
    local_68->Entry = this_01;
    std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>::
    push_back((vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
               *)cacheKeys.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_68);
  }
  else {
    local_a0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_30);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_98,&local_a0);
    while( true ) {
      key.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_30);
      bVar1 = __gnu_cxx::operator!=
                        (&local_98,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&key.field_2 + 8));
      if (!bVar1) break;
      pbVar6 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_98);
      std::__cxx11::string::string((string *)local_c8,(string *)pbVar6);
      pcVar4 = cmake::GetState(this->CMakeInstance);
      pbVar6 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_98);
      CVar2 = cmState::GetCacheEntryType(pcVar4,pbVar6);
      if (((CVar2 != INTERNAL) && (CVar2 != STATIC)) &&
         ((CVar2 != UNINITIALIZED &&
          (bVar1 = LookForCacheEntry(this,(string *)local_c8),
          pbVar3 = cacheKeys.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage, !bVar1)))) {
        pcVar5 = (cmCursesCacheEntryComposite *)operator_new(0x40);
        cmCursesCacheEntryComposite::cmCursesCacheEntryComposite
                  (pcVar5,(string *)local_c8,this->CMakeInstance,true,0x1e,(int)comp);
        it_2._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar5;
        std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>::
        push_back((vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                   *)pbVar3,(value_type *)&it_2);
        this->OkToGenerate = false;
      }
      std::__cxx11::string::~string((string *)local_c8);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_98);
    }
    local_e8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_30);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_e0,&local_e8);
    while( true ) {
      key_1.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_30);
      bVar1 = __gnu_cxx::operator!=
                        (&local_e0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&key_1.field_2 + 8));
      if (!bVar1) break;
      pbVar6 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_e0);
      std::__cxx11::string::string((string *)local_110,(string *)pbVar6);
      pcVar4 = cmake::GetState(this->CMakeInstance);
      pbVar6 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_e0);
      local_114 = cmState::GetCacheEntryType(pcVar4,pbVar6);
      if ((((local_114 != INTERNAL) && (local_114 != STATIC)) && (local_114 != UNINITIALIZED)) &&
         (bVar1 = LookForCacheEntry(this,(string *)local_110),
         pbVar3 = cacheKeys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage, bVar1)) {
        pcVar5 = (cmCursesCacheEntryComposite *)operator_new(0x40);
        cmCursesCacheEntryComposite::cmCursesCacheEntryComposite
                  (pcVar5,(string *)local_110,this->CMakeInstance,false,0x1e,(int)comp);
        local_120 = pcVar5;
        std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>::
        push_back((vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                   *)pbVar3,&local_120);
      }
      std::__cxx11::string::~string((string *)local_110);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_e0);
    }
  }
  if (this->Entries !=
      (vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *)0x0)
  {
    cmDeleteAll<std::vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>>>
              (this->Entries);
  }
  this_00 = this->Entries;
  if (this_00 !=
      (vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *)0x0)
  {
    std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>::
    ~vector(this_00);
    operator_delete(this_00,0x18);
  }
  this->Entries =
       (vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *)
       cacheKeys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  RePost(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return;
}

Assistant:

void cmCursesMainForm::InitializeUI()
{
  // Create a vector of cmCursesCacheEntryComposite's
  // which contain labels, entries and new entry markers
  std::vector<cmCursesCacheEntryComposite*>* newEntries =
    new std::vector<cmCursesCacheEntryComposite*>;
  std::vector<std::string> cacheKeys =
      this->CMakeInstance->GetState()->GetCacheEntryKeys();
  newEntries->reserve(cacheKeys.size());

  // Count non-internal and non-static entries
  int count=0;

  for(std::vector<std::string>::const_iterator it = cacheKeys.begin();
      it != cacheKeys.end(); ++it)
    {
    cmState::CacheEntryType t = this->CMakeInstance->GetState()
        ->GetCacheEntryType(*it);
    if (t != cmState::INTERNAL &&
        t != cmState::STATIC &&
        t != cmState::UNINITIALIZED)
      {
      ++count;
      }
    }

  int entrywidth = this->InitialWidth - 35;

  cmCursesCacheEntryComposite* comp;
  if ( count == 0 )
    {
    // If cache is empty, display a label saying so and a
    // dummy entry widget (does not respond to input)
    comp = new cmCursesCacheEntryComposite("EMPTY CACHE", 30, 30);
    comp->Entry = new cmCursesDummyWidget(1, 1, 1, 1);
    newEntries->push_back(comp);
    }
  else
    {
    // Create the composites.

    // First add entries which are new
    for(std::vector<std::string>::const_iterator it = cacheKeys.begin();
        it != cacheKeys.end(); ++it)
      {
      std::string key = *it;
      cmState::CacheEntryType t = this->CMakeInstance->GetState()
          ->GetCacheEntryType(*it);
      if (t == cmState::INTERNAL ||
          t == cmState::STATIC ||
          t == cmState::UNINITIALIZED )
        {
        continue;
        }

      if (!this->LookForCacheEntry(key))
        {
        newEntries->push_back(new cmCursesCacheEntryComposite(key,
                                                          this->CMakeInstance,
                                                          true, 30,
                                                          entrywidth));
        this->OkToGenerate = false;
        }
      }

    // then add entries which are old
    for(std::vector<std::string>::const_iterator it = cacheKeys.begin();
        it != cacheKeys.end(); ++it)
      {
      std::string key = *it;
      cmState::CacheEntryType t = this->CMakeInstance->GetState()
          ->GetCacheEntryType(*it);
      if (t == cmState::INTERNAL ||
          t == cmState::STATIC ||
          t == cmState::UNINITIALIZED )
        {
        continue;
        }

      if (this->LookForCacheEntry(key))
        {
        newEntries->push_back(new cmCursesCacheEntryComposite(key,
                                                          this->CMakeInstance,
                                                          false, 30,
                                                          entrywidth));
        }
      }
    }

  // Clean old entries
  if (this->Entries)
    {
    cmDeleteAll(*this->Entries);
    }
  delete this->Entries;
  this->Entries = newEntries;

  // Compute fields from composites
  this->RePost();
}